

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_set_name(ATTACH_HANDLE attach,char *name_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE name_amqp_value;
  ATTACH_INSTANCE *attach_instance;
  int result;
  char *name_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0xfe6;
  }
  else {
    item_value = amqpvalue_create_string(name_value);
    if (item_value == (AMQP_VALUE)0x0) {
      attach_instance._4_4_ = 0xfee;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(attach->composite_value,0,item_value);
      if (iVar1 == 0) {
        attach_instance._4_4_ = 0;
      }
      else {
        attach_instance._4_4_ = 0xff4;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_set_name(ATTACH_HANDLE attach, const char* name_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE name_amqp_value = amqpvalue_create_string(name_value);
        if (name_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 0, name_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(name_amqp_value);
        }
    }

    return result;
}